

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_SetConstVar(Zyx_Man_t *p,int Var,int Value)

{
  int iVar1;
  int iLit;
  
  iLit = Abc_Var2Lit(Var,(uint)(Value == 0));
  iVar1 = bmcg_sat_solver_addclause(p->pSat,&iLit,1);
  if (iVar1 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x26f,"void Zyx_SetConstVar(Zyx_Man_t *, int, int)");
  }
  iVar1 = Vec_IntEntry(p->vVarValues,Var);
  if (iVar1 == -1) {
    if ((-1 < Var) && (Var < p->vVarValues->nSize)) {
      p->vVarValues->pArray[(uint)Var] = Value;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("Vec_IntEntry(p->vVarValues, Var) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                ,0x270,"void Zyx_SetConstVar(Zyx_Man_t *, int, int)");
}

Assistant:

void Zyx_SetConstVar( Zyx_Man_t * p, int Var, int Value )
{
    int iLit = Abc_Var2Lit( Var, !Value );
    int status = bmcg_sat_solver_addclause( p->pSat, &iLit, 1 );
    assert( status );
    assert( Vec_IntEntry(p->vVarValues, Var) == -1 );
    Vec_IntWriteEntry( p->vVarValues, Var, Value );
    //printf( "Setting var %d to value %d.\n", Var, Value );
}